

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_nlzc_b_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = (ulong)*(byte *)((env->active_fpu).fpr + ws);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  lVar3 = (ulong)wd * 0x10;
  *(char *)((env->active_fpu).fpr + wd) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 1) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 2) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 3) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 4) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 5) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 6) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 7) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 8) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 9) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 10) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xb) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xc) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xd) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xe) = (char)iVar5 - (char)uVar2;
  uVar2 = (ulong)*(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
  iVar5 = 8;
  uVar6 = 4;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(char *)((long)(env->active_fpu).fpr + lVar3 + 0xf) = (char)iVar5 - (char)uVar2;
  return;
}

Assistant:

void helper_msa_nlzc_b(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->b[0]  = msa_nlzc_df(DF_BYTE, pws->b[0]);
    pwd->b[1]  = msa_nlzc_df(DF_BYTE, pws->b[1]);
    pwd->b[2]  = msa_nlzc_df(DF_BYTE, pws->b[2]);
    pwd->b[3]  = msa_nlzc_df(DF_BYTE, pws->b[3]);
    pwd->b[4]  = msa_nlzc_df(DF_BYTE, pws->b[4]);
    pwd->b[5]  = msa_nlzc_df(DF_BYTE, pws->b[5]);
    pwd->b[6]  = msa_nlzc_df(DF_BYTE, pws->b[6]);
    pwd->b[7]  = msa_nlzc_df(DF_BYTE, pws->b[7]);
    pwd->b[8]  = msa_nlzc_df(DF_BYTE, pws->b[8]);
    pwd->b[9]  = msa_nlzc_df(DF_BYTE, pws->b[9]);
    pwd->b[10] = msa_nlzc_df(DF_BYTE, pws->b[10]);
    pwd->b[11] = msa_nlzc_df(DF_BYTE, pws->b[11]);
    pwd->b[12] = msa_nlzc_df(DF_BYTE, pws->b[12]);
    pwd->b[13] = msa_nlzc_df(DF_BYTE, pws->b[13]);
    pwd->b[14] = msa_nlzc_df(DF_BYTE, pws->b[14]);
    pwd->b[15] = msa_nlzc_df(DF_BYTE, pws->b[15]);
}